

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_join.cpp
# Opt level: O0

vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::PhysicalJoin::GetSources(PhysicalJoin *this)

{
  byte bVar1;
  const_reference this_00;
  PhysicalOperator *pPVar2;
  long *in_RSI;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  *in_RDI;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *result;
  size_type in_stack_ffffffffffffffa8;
  PhysicalJoin *__uref;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  *this_01;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  this_00 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                      ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)in_RDI,
                       in_stack_ffffffffffffffa8);
  pPVar2 = ::std::reference_wrapper<duckdb::PhysicalOperator>::get(this_00);
  (*pPVar2->_vptr_PhysicalOperator[0x25])(in_RDI);
  bVar1 = (**(code **)(*in_RSI + 0x98))();
  if ((bVar1 & 1) != 0) {
    __uref = (PhysicalJoin *)&stack0xffffffffffffffd0;
    ::std::reference_wrapper<duckdb::PhysicalOperator_const>::
    reference_wrapper<duckdb::PhysicalJoin_const&,void,duckdb::PhysicalOperator_const*>
              ((reference_wrapper<const_duckdb::PhysicalOperator> *)this_01,__uref);
    ::std::
    vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
    ::push_back(this_01,(value_type *)__uref);
  }
  return (vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *)this_01;
}

Assistant:

vector<const_reference<PhysicalOperator>> PhysicalJoin::GetSources() const {
	auto result = children[0].get().GetSources();
	if (IsSource()) {
		result.push_back(*this);
	}
	return result;
}